

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O0

void __thiscall leveldb::VersionSet::~VersionSet(VersionSet *this)

{
  void *pvVar1;
  long in_RDI;
  long in_FS_OFFSET;
  Version *in_stack_ffffffffffffffb8;
  long local_30;
  Version *this_00;
  
  this_00 = *(Version **)(in_FS_OFFSET + 0x28);
  Version::Unref(in_stack_ffffffffffffffb8);
  if (*(long *)(in_RDI + 0x88) != in_RDI + 0x80) {
    __assert_fail("dummy_versions_.next_ == &dummy_versions_",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/db/version_set.cc"
                  ,0x2f4,"leveldb::VersionSet::~VersionSet()");
  }
  pvVar1 = *(void **)(in_RDI + 0x78);
  if (pvVar1 != (void *)0x0) {
    log::Writer::~Writer((Writer *)in_stack_ffffffffffffffb8);
    operator_delete(pvVar1,0x20);
  }
  if (*(long **)(in_RDI + 0x70) != (long *)0x0) {
    (**(code **)(**(long **)(in_RDI + 0x70) + 8))();
  }
  local_30 = in_RDI + 0x250;
  do {
    local_30 = local_30 + -0x20;
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffffb8);
  } while (local_30 != in_RDI + 0x170);
  Version::~Version(this_00);
  InternalKeyComparator::~InternalKeyComparator((InternalKeyComparator *)in_stack_ffffffffffffffb8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffffb8);
  if (*(Version **)(in_FS_OFFSET + 0x28) == this_00) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

VersionSet::~VersionSet() {
  current_->Unref();
  assert(dummy_versions_.next_ == &dummy_versions_);  // List must be empty
  delete descriptor_log_;
  delete descriptor_file_;
}